

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udataswp.cpp
# Opt level: O3

UDataSwapper *
udata_openSwapperForInputData_63
          (void *data,int32_t length,UBool outIsBigEndian,uint8_t outCharset,UErrorCode *pErrorCode)

{
  UDataSwapper *pUVar1;
  ushort uVar2;
  ushort uVar3;
  
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((data == (void *)0x0) || ((uint)length < 0x18 || 1 < outCharset)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      if (((*(char *)((long)data + 2) == -0x26) && (*(char *)((long)data + 3) == '\'')) &&
         (*(char *)((long)data + 10) == '\x02')) {
        uVar2 = *data;
        if (*(char *)((long)data + 8) == '\0') {
          uVar3 = *(ushort *)((long)data + 4);
        }
        else {
          uVar2 = uVar2 << 8 | uVar2 >> 8;
          uVar3 = *(ushort *)((long)data + 4) << 8 | *(ushort *)((long)data + 4) >> 8;
        }
        if ((0x13 < uVar3 && 0x17 < uVar2) &&
           (uVar3 + 4 <= (uint)uVar2 && (uint)uVar2 <= (uint)length)) {
          pUVar1 = udata_openSwapper_63
                             (*(char *)((long)data + 8),*(uint8_t *)((long)data + 9),outIsBigEndian,
                              outCharset,pErrorCode);
          return pUVar1;
        }
      }
      *pErrorCode = U_UNSUPPORTED_ERROR;
    }
  }
  return (UDataSwapper *)0x0;
}

Assistant:

U_CAPI UDataSwapper * U_EXPORT2
udata_openSwapperForInputData(const void *data, int32_t length,
                              UBool outIsBigEndian, uint8_t outCharset,
                              UErrorCode *pErrorCode) {
    const DataHeader *pHeader;
    uint16_t headerSize, infoSize;
    UBool inIsBigEndian;
    int8_t inCharset;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if( data==NULL ||
        (length>=0 && length<(int32_t)sizeof(DataHeader)) ||
        outCharset>U_EBCDIC_FAMILY
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    pHeader=(const DataHeader *)data;
    if( (length>=0 && length<(int32_t)sizeof(DataHeader)) ||
        pHeader->dataHeader.magic1!=0xda ||
        pHeader->dataHeader.magic2!=0x27 ||
        pHeader->info.sizeofUChar!=2
    ) {
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inIsBigEndian=(UBool)pHeader->info.isBigEndian;
    inCharset=pHeader->info.charsetFamily;

    if(inIsBigEndian==U_IS_BIG_ENDIAN) {
        headerSize=pHeader->dataHeader.headerSize;
        infoSize=pHeader->info.size;
    } else {
        headerSize=uprv_readSwapUInt16(pHeader->dataHeader.headerSize);
        infoSize=uprv_readSwapUInt16(pHeader->info.size);
    }

    if( headerSize<sizeof(DataHeader) ||
        infoSize<sizeof(UDataInfo) ||
        headerSize<(sizeof(pHeader->dataHeader)+infoSize) ||
        (length>=0 && length<headerSize)
    ) {
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    return udata_openSwapper(inIsBigEndian, inCharset, outIsBigEndian, outCharset, pErrorCode);
}